

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

void __thiscall soul::Value::~Value(Value *this)

{
  Value *this_local;
  
  LazyAllocatedData::~LazyAllocatedData(&this->allocatedData);
  Type::~Type(&this->type);
  return;
}

Assistant:

Value::~Value() = default;